

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PushLine(Hunk *this,char edit,char *line)

{
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *this_00;
  value_type *__x;
  char in_SIL;
  long in_RDI;
  char **in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  value_type *in_stack_ffffffffffffff88;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  *in_stack_ffffffffffffff90;
  Hunk *in_stack_ffffffffffffffb0;
  
  if (in_SIL == ' ') {
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
    FlushEdits(in_stack_ffffffffffffffb0);
    this_00 = (list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               *)(in_RDI + 0x28);
    std::make_pair<char,char_const*&>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (this_00,in_stack_ffffffffffffff88);
  }
  else if (in_SIL == '+') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    std::make_pair<char,char_const*&>((char *)(in_RDI + 0x40),in_stack_ffffffffffffff78);
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else if (in_SIL == '-') {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    __x = (value_type *)(in_RDI + 0x58);
    std::make_pair<char,char_const*&>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (in_stack_ffffffffffffff90,__x);
  }
  return;
}

Assistant:

void PushLine(char edit, const char* line) {
    switch (edit) {
      case ' ':
        ++common_;
        FlushEdits();
        hunk_.push_back(std::make_pair(' ', line));
        break;
      case '-':
        ++removes_;
        hunk_removes_.push_back(std::make_pair('-', line));
        break;
      case '+':
        ++adds_;
        hunk_adds_.push_back(std::make_pair('+', line));
        break;
    }
  }